

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O1

int32_t normalizeSecondAndAppend
                  (UNormalizer2 *norm2,UChar *first,int32_t firstLength,int32_t firstCapacity,
                  UChar *second,int32_t secondLength,UBool doNormalize,UErrorCode *pErrorCode)

{
  int iVar1;
  int32_t iVar2;
  long *plVar3;
  undefined4 uVar4;
  UChar *pUVar5;
  UnicodeString safeMiddle;
  UnicodeString firstString;
  ReorderingBuffer buffer;
  Char16Ptr local_130;
  ConstChar16Ptr local_128;
  UChar *local_120;
  UChar *local_110;
  UChar *local_100;
  UnicodeString local_f0;
  UnicodeString local_b0;
  ReorderingBuffer local_70;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if (second == (UChar *)0x0) {
    if (secondLength != 0) goto LAB_0029320a;
  }
  else if (secondLength < -1) goto LAB_0029320a;
  if (first == (UChar *)0x0) {
    if (firstCapacity != 0 || firstLength != 0) goto LAB_0029320a;
  }
  else if (firstLength < -1 || firstCapacity < 0) goto LAB_0029320a;
  if (first != (UChar *)0x0 && first == second) {
LAB_0029320a:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  icu_63::UnicodeString::UnicodeString(&local_b0,first,firstLength,firstCapacity);
  uVar4 = local_b0.fUnion.fFields.fLength;
  if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
    uVar4 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (secondLength == 0) goto LAB_0029341e;
  if (norm2 == (UNormalizer2 *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)__dynamic_cast(norm2,&icu_63::Normalizer2::typeinfo,
                                    &icu_63::Normalizer2WithImpl::typeinfo,0);
  }
  if (plVar3 == (long *)0x0) {
    local_128.p_ = second;
    icu_63::UnicodeString::UnicodeString
              (&local_f0,(byte)((uint)secondLength >> 0x1f),&local_128,secondLength);
    local_110 = local_128.p_;
    (**(code **)(*(long *)norm2 + 0x28 + (ulong)(doNormalize == '\0') * 8))
              (norm2,&local_b0,&local_f0,pErrorCode);
  }
  else {
    local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003bf258;
    local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_70.impl = (Normalizer2Impl *)plVar3[1];
    local_70.str = &local_b0;
    local_70.start = (UChar *)0x0;
    local_70.reorderStart._0_5_ = 0;
    local_70.reorderStart._5_3_ = 0;
    local_70.limit._0_5_ = 0;
    local_70._37_8_ = 0;
    iVar1 = icu_63::ReorderingBuffer::init
                      (&local_70,(EVP_PKEY_CTX *)(ulong)(uVar4 + secondLength + 1));
    if ((char)iVar1 != '\0') {
      pUVar5 = (UChar *)0x0;
      if (-1 < secondLength) {
        pUVar5 = second + secondLength;
      }
      (**(code **)(*plVar3 + 0x98))
                (plVar3,second,pUVar5,(int)doNormalize,&local_f0,&local_70,pErrorCode);
    }
    icu_63::ReorderingBuffer::~ReorderingBuffer(&local_70);
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        local_b0.fUnion.fFields.fLength = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if ((first != (UChar *)0x0) && (firstCapacity < local_b0.fUnion.fFields.fLength))
      goto LAB_002933c8;
    }
    else if (first != (UChar *)0x0) {
LAB_002933c8:
      if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
        local_f0.fUnion.fFields.fLength = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      pUVar5 = first + (int)uVar4 + -(long)local_f0.fUnion.fFields.fLength;
      icu_63::UnicodeString::doExtract(&local_f0,0,0x7fffffff,pUVar5,0);
      local_100 = pUVar5;
      if ((int)uVar4 < firstCapacity) {
        first[(int)uVar4] = L'\0';
      }
    }
  }
  icu_63::UnicodeString::~UnicodeString(&local_f0);
LAB_0029341e:
  local_130.p_ = first;
  iVar2 = icu_63::UnicodeString::extract(&local_b0,&local_130,firstCapacity,pErrorCode);
  local_120 = local_130.p_;
  icu_63::UnicodeString::~UnicodeString(&local_b0);
  return iVar2;
}

Assistant:

static int32_t
normalizeSecondAndAppend(const UNormalizer2 *norm2,
                         UChar *first, int32_t firstLength, int32_t firstCapacity,
                         const UChar *second, int32_t secondLength,
                         UBool doNormalize,
                         UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if( (second==NULL ? secondLength!=0 : secondLength<-1) ||
        (first==NULL ? (firstCapacity!=0 || firstLength!=0) :
                       (firstCapacity<0 || firstLength<-1)) ||
        (first==second && first!=NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString firstString(first, firstLength, firstCapacity);
    firstLength=firstString.length();  // In case it was -1.
    // secondLength==0: Nothing to do, and n2wi->normalizeAndAppend(NULL, NULL, buffer, ...) would crash.
    if(secondLength!=0) {
        const Normalizer2 *n2=(const Normalizer2 *)norm2;
        const Normalizer2WithImpl *n2wi=dynamic_cast<const Normalizer2WithImpl *>(n2);
        if(n2wi!=NULL) {
            // Avoid duplicate argument checking and support NUL-terminated src.
            UnicodeString safeMiddle;
            {
                ReorderingBuffer buffer(n2wi->impl, firstString);
                if(buffer.init(firstLength+secondLength+1, *pErrorCode)) {  // destCapacity>=-1
                    n2wi->normalizeAndAppend(second, secondLength>=0 ? second+secondLength : NULL,
                                             doNormalize, safeMiddle, buffer, *pErrorCode);
                }
            }  // The ReorderingBuffer destructor finalizes firstString.
            if(U_FAILURE(*pErrorCode) || firstString.length()>firstCapacity) {
                // Restore the modified suffix of the first string.
                // This does not restore first[] array contents between firstLength and firstCapacity.
                // (That might be uninitialized memory, as far as we know.)
                if(first!=NULL) { /* don't dereference NULL */
                  safeMiddle.extract(0, 0x7fffffff, first+firstLength-safeMiddle.length());
                  if(firstLength<firstCapacity) {
                    first[firstLength]=0;  // NUL-terminate in case it was originally.
                  }
                }
            }
        } else {
            UnicodeString secondString(secondLength<0, second, secondLength);
            if(doNormalize) {
                n2->normalizeSecondAndAppend(firstString, secondString, *pErrorCode);
            } else {
                n2->append(firstString, secondString, *pErrorCode);
            }
        }
    }
    return firstString.extract(first, firstCapacity, *pErrorCode);
}